

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_copy_to_file.cpp
# Opt level: O2

vector<duckdb::LogicalType,_true> *
duckdb::LogicalCopyToFile::GetTypesWithoutPartitions
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          vector<duckdb::LogicalType,_true> *col_types,vector<unsigned_long,_true> *part_cols,
          bool write_part_cols)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  iterator iVar1;
  const_reference __x;
  undefined7 in_register_00000009;
  size_type local_68;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> part_col_set;
  
  if ((int)CONCAT71(in_register_00000009,write_part_cols) == 0) {
    __first._M_current =
         (part_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (part_cols->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      (__return_storage_ptr__->
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
      set<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)
                 &part_col_set,__first,__last);
      for (local_68 = 0;
          local_68 <
          (ulong)(((long)(col_types->
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(col_types->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18); local_68 = local_68 + 1)
      {
        iVar1 = ::std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::find(&part_col_set._M_t,&local_68);
        if ((_Rb_tree_header *)iVar1._M_node == &part_col_set._M_t._M_impl.super__Rb_tree_header) {
          __x = vector<duckdb::LogicalType,_true>::get<true>(col_types,local_68);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&__return_storage_ptr__->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
        }
      }
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&part_col_set._M_t);
      return __return_storage_ptr__;
    }
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &col_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalType> LogicalCopyToFile::GetTypesWithoutPartitions(const vector<LogicalType> &col_types,
                                                                 const vector<idx_t> &part_cols, bool write_part_cols) {
	if (write_part_cols || part_cols.empty()) {
		return col_types;
	}
	vector<LogicalType> types;
	set<idx_t> part_col_set(part_cols.begin(), part_cols.end());
	for (idx_t col_idx = 0; col_idx < col_types.size(); col_idx++) {
		if (part_col_set.find(col_idx) == part_col_set.end()) {
			types.push_back(col_types[col_idx]);
		}
	}
	return types;
}